

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkLock::IntFromDescriptor
          (ChLinkLock *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  Scalar SVar2;
  ChConstraintTwoBodies *pCVar3;
  Scalar *pSVar4;
  ChLinkLimit *pCVar5;
  int i;
  int iVar6;
  int iVar7;
  
  iVar7 = 0;
  for (iVar6 = 0; iVar6 < (this->mask).super_ChLinkMask.nconstr; iVar6 = iVar6 + 1) {
    pCVar3 = ChLinkMask::Constr_N(&(this->mask).super_ChLinkMask,iVar6);
    if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.active == true) {
      pCVar3 = ChLinkMask::Constr_N(&(this->mask).super_ChLinkMask,iVar6);
      dVar1 = (pCVar3->super_ChConstraintTwo).super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar7 + off_L));
      iVar7 = iVar7 + 1;
      *pSVar4 = dVar1;
    }
  }
  iVar6 = (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
            super_ChObj._vptr_ChObj[0x19])(this);
  pCVar5 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
      pCVar5 = (this->limit_X)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
    }
  }
  pCVar5 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
      pCVar5 = (this->limit_Y)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
    }
  }
  pCVar5 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
      pCVar5 = (this->limit_Z)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
    }
  }
  pCVar5 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
      pCVar5 = (this->limit_Rx)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
    }
  }
  pCVar5 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
      pCVar5 = (this->limit_Ry)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
    }
  }
  pCVar5 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar5 != (ChLinkLimit *)0x0) && (pCVar5->m_active == true)) {
    if ((pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      iVar6 = iVar6 + 1;
      *pSVar4 = SVar2;
      pCVar5 = (this->limit_Rz)._M_t.
               super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>
               ._M_t.
               super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>
               .super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
    }
    if ((pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      SVar2 = (pCVar5->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                          (ulong)(iVar6 + off_L));
      *pSVar4 = SVar2;
    }
  }
  return;
}

Assistant:

void ChLinkLock::IntFromDescriptor(const unsigned int off_v,
                                   ChStateDelta& v,
                                   const unsigned int off_L,
                                   ChVectorDynamic<>& L) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            L(off_L + cnt) = mask.Constr_N(i).Get_l_i();
            cnt++;
        }
    }

    int local_offset = this->GetDOC_c();

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_X->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_X->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_X->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Y->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Y->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Y->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Z->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Z->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Z->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Rx->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Rx->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Rx->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Ry->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Ry->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Ry->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Rz->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Rz->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Rz->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
}